

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dijkstra.h
# Opt level: O2

void dijkstra_sync(vector<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                   *adj_list,int from,vector<int,_std::allocator<int>_> *dists)

{
  pointer piVar1;
  pointer pvVar2;
  long lVar3;
  pointer ppVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  size_type __n;
  int v;
  ulong __n_00;
  int iVar11;
  reference rVar12;
  Timer timer;
  vector<bool,_std::allocator<bool>_> used;
  
  uVar6 = ((long)(adj_list->
                 super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish -
          (long)(adj_list->
                super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start) / 0x18;
  iVar11 = (int)uVar6;
  used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p =
       (_Bit_type *)
       CONCAT44(used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                _M_start.super__Bit_iterator_base._M_p._4_4_,999999);
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (dists,(long)iVar11,(value_type_conflict *)&used);
  (dists->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
  [from] = 0;
  used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage
       = (_Bit_pointer)0x0;
  std::vector<bool,_std::allocator<bool>_>::_M_fill_assign(&used,(long)iVar11,false);
  Timer::Timer(&timer);
  iVar5 = 0;
  iVar7 = 0;
  if (0 < iVar11) {
    iVar7 = iVar11;
  }
  for (; iVar5 != iVar7; iVar5 = iVar5 + 1) {
    __n_00 = 0;
    uVar8 = 0xffffffffffffffff;
    while( true ) {
      __n = (size_type)(int)uVar8;
      if ((uVar6 & 0xffffffff) == __n_00) break;
      rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,__n_00);
      if (((*rVar12._M_p & rVar12._M_mask) == 0) &&
         (((int)uVar8 == -1 ||
          (piVar1 = (dists->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start, piVar1[__n_00] < piVar1[__n])))) {
        uVar8 = __n_00 & 0xffffffff;
      }
      __n_00 = __n_00 + 1;
    }
    if ((dists->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[__n] == 999999) break;
    rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](&used,__n);
    *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
    pvVar2 = (adj_list->
             super__Vector_base<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::allocator<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar3 = *(long *)&pvVar2[__n].
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data;
    ppVar4 = *(pointer *)
              ((long)&pvVar2[__n].
                      super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                      ._M_impl.super__Vector_impl_data + 8);
    piVar1 = (dists->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    for (lVar9 = 0; (long)ppVar4 - lVar3 >> 3 != lVar9; lVar9 = lVar9 + 1) {
      iVar11 = *(int *)(lVar3 + lVar9 * 8);
      iVar10 = piVar1[__n] + *(int *)(lVar3 + 4 + lVar9 * 8);
      if (iVar10 < piVar1[iVar11]) {
        piVar1[iVar11] = iVar10;
      }
    }
  }
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&used.super__Bvector_base<std::allocator<bool>_>);
  return;
}

Assistant:

void dijkstra_sync(const vector<vector<pair<int, int>>>& adj_list, int from, vector<int>& dists){
    int vs = adj_list.size();
    dists.assign(vs, MAX_INT);
    dists[from] = 0;
    vector<bool> used;
    used.assign(vs, false);
    int curr_v;

    Timer timer = Timer();

    for (int i=0; i<vs; i++){
        // search unused
        curr_v = -1;

        for (int v=0; v<vs; v++) {
            if (!used[v] && (curr_v == -1 || dists[v] < dists[curr_v])) {
                curr_v = v;
            }
        }
        // have visited all reachable vertexes
        if (dists[curr_v] == MAX_INT){
            return;
        }

        used[curr_v] = true;

        int to, weight;
        // Search least path
        for (int j=0; j<adj_list[curr_v].size(); j++){
            to = adj_list[curr_v][j].first;
            weight = adj_list[curr_v][j].second;
            if (dists[curr_v] + weight < dists[to]){
                // Relax
                dists[to] = dists[curr_v] + weight;
            }
        }
    }
}